

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDAWBIC.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  double dVar2;
  allocator local_2f1;
  vector<double,_std::allocator<double>_> alpha;
  vector<double,_std::allocator<double>_> beta;
  string local_2c0;
  string local_2a0;
  string local_280;
  BOWFileParser parser;
  
  std::__cxx11::string::string((string *)&local_280,argv[1],(allocator *)&alpha);
  BOWFileParser::BOWFileParser(&parser,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::string((string *)&local_2a0,argv[2],(allocator *)&beta);
  readHyperParam(&alpha,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string((string *)&local_2c0,argv[3],&local_2f1);
  readHyperParam(&beta,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::operator<<(poVar1,',');
  dVar2 = runWBICMetropolis(&parser._frequencyMatrix,&parser._docVoca,&alpha,&beta,0);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&beta.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&alpha.super__Vector_base<double,_std::allocator<double>_>);
  BOWFileParser::~BOWFileParser(&parser);
  return 0;
}

Assistant:

int main(int argc, char *argv[]){
    BOWFileParser parser(argv[1]);
    vector<double> alpha = readHyperParam(argv[2]);
    vector<double> beta = readHyperParam(argv[3]);
    unsigned int n;
    if(argc == 5){
        n = atoi(argv[4]);
    }
    cout<<alpha.size()<<','<<runWBICMetropolis(parser.getFrequencyMatrix(), parser.getDocVoca(), alpha, beta)<<endl;
    return 0;
}